

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

bool CB_ADF::update_statistics(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  float fVar1;
  uint32_t action;
  bool bVar2;
  pointer ppeVar3;
  ulong uVar4;
  size_t num_features;
  size_t i;
  ulong uVar5;
  float loss;
  
  action = ((ec->pred).a_s._begin)->action;
  num_features = 0;
  uVar5 = 0;
  while( true ) {
    ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3;
    if (uVar4 <= uVar5) break;
    bVar2 = CB::ec_is_example_header(ppeVar3[uVar5]);
    if (!bVar2) {
      num_features = num_features +
                     (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar5]->num_features;
    }
    uVar5 = uVar5 + 1;
  }
  fVar1 = (c->gen_cs).known_cost.probability;
  loss = 0.0;
  bVar2 = 0.0 < fVar1;
  if (0.0 < fVar1) {
    loss = CB_ALGS::get_unbiased_cost(&(c->gen_cs).known_cost,&(c->gen_cs).pred_scores,action);
    ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3;
  }
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    bVar2 = (bool)(bVar2 & ppeVar3[uVar5]->test_only);
  }
  shared_data::update(all->sd,bVar2,0.0 < fVar1,loss,ec->weight,num_features);
  return 0.0 < fVar1;
}

Assistant:

bool update_statistics(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  size_t num_features = 0;

  uint32_t action = ec.pred.a_s[0].action;
  for (size_t i = 0; i < (*ec_seq).size(); i++)
    if (!CB::ec_is_example_header(*(*ec_seq)[i]))
      num_features += (*ec_seq)[i]->num_features;

  float loss = 0.;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
    loss = get_unbiased_cost(&(c.gen_cs.known_cost), c.gen_cs.pred_scores, action);
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);
  return labeled_example;
}